

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_point.cpp
# Opt level: O0

int ON_ParsePointExpression
              (wchar_t *str,int str_count,AngleUnitSystem default_str_angle_unit_system,
              LengthUnitSystem point_value_unit_system,ON_3dPoint *point_value)

{
  ON_ParseSettings parse_settings;
  int iVar1;
  undefined1 local_40 [8];
  ON_ParseSettings ps;
  ON_3dPoint *point_value_local;
  LengthUnitSystem point_value_unit_system_local;
  AngleUnitSystem default_str_angle_unit_system_local;
  int str_count_local;
  wchar_t *str_local;
  
  local_40 = (undefined1  [8])ON_ParseSettings::DefaultSettingsInRadians.m_true_default_bits;
  ps.m_true_default_bits = ON_ParseSettings::DefaultSettingsInRadians.m_false_default_bits;
  ps.m_false_default_bits = (ON__UINT32  [2])ON_ParseSettings::DefaultSettingsInRadians._16_8_;
  ps._16_8_ = ON_ParseSettings::DefaultSettingsInRadians.m_reserved;
  ps.m_reserved = (ON__UINT64)point_value;
  ON_ParseSettings::SetDefaultAngleUnitSystem
            ((ON_ParseSettings *)local_40,default_str_angle_unit_system);
  parse_settings.m_false_default_bits[0] = ps.m_true_default_bits[0];
  parse_settings.m_false_default_bits[1] = ps.m_true_default_bits[1];
  parse_settings.m_true_default_bits[0] = local_40._0_4_;
  parse_settings.m_true_default_bits[1] = local_40._4_4_;
  parse_settings._16_8_ = ps.m_false_default_bits;
  parse_settings.m_reserved._0_4_ = ps.m_reserved_bits;
  parse_settings.m_reserved._4_2_ = ps.m_context_locale_id;
  parse_settings.m_reserved._6_1_ = ps.m_context_angle_unit_system;
  parse_settings.m_reserved._7_1_ = ps.m_context_length_unit_system;
  iVar1 = ON_ParsePointExpression
                    (str,str_count,parse_settings,point_value_unit_system,
                     (ON_3dPoint *)ps.m_reserved,(ON_ParseSettings *)0x0);
  return iVar1;
}

Assistant:

int ON_ParsePointExpression(
  const wchar_t* str,
  int str_count,
  ON::AngleUnitSystem default_str_angle_unit_system,
  ON::LengthUnitSystem point_value_unit_system,
  ON_3dPoint* point_value
  )
{
  ON_ParseSettings ps(ON_ParseSettings::DefaultSettingsInRadians);
  ps.SetDefaultAngleUnitSystem(default_str_angle_unit_system);
  return ON_ParsePointExpression(
    str,str_count,
    ps,
    point_value_unit_system,point_value,
    0);
}